

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpub.cpp
# Opt level: O0

void __thiscall zmq::xpub_t::xread_activated(xpub_t *this,pipe_t *pipe_)

{
  byte bVar1;
  ulong uVar2;
  metadata_t *prefix_;
  msg_t *this_00;
  size_t sVar3;
  uchar *puVar4;
  blob_t *this_01;
  pipe_t *in_RCX;
  void *in_RDX;
  void *extraout_RDX;
  int __fd;
  pipe_t *in_RSI;
  long in_RDI;
  bool bVar5;
  value_t *in_stack_00000028;
  size_t in_stack_00000030;
  prefix_t in_stack_00000038;
  generic_mtrie_t<zmq::pipe_t> *in_stack_00000040;
  blob_t notification;
  bool first_added;
  rm_result rm_result;
  bool first_part;
  bool notify;
  bool is_subscribe_or_cancel;
  bool subscribe;
  size_t size;
  uchar *data;
  uchar *msg_data;
  metadata_t *metadata;
  msg_t msg;
  value_type *in_stack_fffffffffffffee8;
  blob_t *in_stack_fffffffffffffef0;
  msg_t *in_stack_fffffffffffffef8;
  byte local_d3;
  byte local_d2;
  byte local_d1;
  uchar local_c1 [28];
  undefined1 local_a5 [13];
  blob_t local_98;
  undefined1 local_79;
  rm_result local_78;
  byte local_74;
  byte local_73;
  byte local_72;
  byte local_71;
  size_t local_70;
  value_t *pipe__00;
  undefined8 in_stack_ffffffffffffffb0;
  pipe_t *local_10 [2];
  
  local_10[0] = in_RSI;
  while( true ) {
    __fd = (int)&stack0xffffffffffffffb0;
    uVar2 = pipe_t::read(local_10[0],__fd,in_RDX,(size_t)in_RCX);
    if ((uVar2 & 1) == 0) break;
    prefix_ = msg_t::metadata((msg_t *)&stack0xffffffffffffffb0);
    this_00 = (msg_t *)msg_t::data(in_stack_fffffffffffffef8);
    pipe__00 = (value_t *)0x0;
    local_70 = 0;
    local_71 = 0;
    local_72 = 0;
    local_73 = 0;
    local_74 = (*(byte *)(in_RDI + 0x753) ^ 0xff) & 1;
    bVar1 = msg_t::flags((msg_t *)&stack0xffffffffffffffb0);
    bVar5 = (bVar1 & 1) != 0;
    in_RCX = (pipe_t *)(ulong)bVar5;
    *(bool *)(in_RDI + 0x753) = bVar5;
    if (((local_74 & 1) != 0) || ((*(byte *)(in_RDI + 0x754) & 1) != 0)) {
      bVar5 = msg_t::is_subscribe((msg_t *)&stack0xffffffffffffffb0);
      if ((bVar5) || (bVar5 = msg_t::is_cancel((msg_t *)&stack0xffffffffffffffb0), bVar5)) {
        pipe__00 = (value_t *)msg_t::command_body((msg_t *)in_stack_fffffffffffffef0);
        local_70 = msg_t::command_body_size((msg_t *)in_stack_fffffffffffffee8);
        local_71 = msg_t::is_subscribe((msg_t *)&stack0xffffffffffffffb0);
        local_72 = 1;
      }
      else {
        sVar3 = msg_t::size(in_stack_fffffffffffffef8);
        if ((sVar3 != 0) && ((*(char *)&this_00->_u == '\0' || (*(char *)&this_00->_u == '\x01'))))
        {
          pipe__00 = (value_t *)((long)&this_00->_u + 1);
          local_70 = msg_t::size(in_stack_fffffffffffffef8);
          local_70 = local_70 - 1;
          local_71 = *(char *)&this_00->_u == '\x01';
          local_72 = 1;
        }
      }
    }
    if ((local_74 & 1) != 0) {
      local_d1 = 1;
      if ((*(byte *)(in_RDI + 0x755) & 1) != 0) {
        local_d1 = local_72;
      }
      in_RCX = (pipe_t *)(CONCAT71((int7)((ulong)in_RDI >> 8),local_d1) & 0xffffffffffffff01);
      *(char *)(in_RDI + 0x754) = (char)in_RCX;
    }
    if ((local_72 & 1) == 0) {
      if (*(char *)(in_RDI + 0x14c) != '\x01') {
        this_01 = (blob_t *)(in_RDI + 0x7f8);
        msg_t::size(this_00);
        blob_t::blob_t(this_01,(uchar *)this_00,(size_t)in_stack_fffffffffffffef0);
        std::deque<zmq::blob_t,_std::allocator<zmq::blob_t>_>::push_back
                  ((deque<zmq::blob_t,_std::allocator<zmq::blob_t>_> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        blob_t::~blob_t(in_stack_fffffffffffffef0);
        in_stack_fffffffffffffef8 = this_00;
        if (prefix_ != (metadata_t *)0x0) {
          metadata_t::add_ref((metadata_t *)0x2e1355);
          in_stack_fffffffffffffef8 = this_00;
        }
        std::deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>::push_back
                  ((deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_> *)
                   in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
        in_stack_fffffffffffffef0 = (blob_t *)(in_RDI + 0x898);
        local_c1[0] = msg_t::flags((msg_t *)&stack0xffffffffffffffb0);
        __fd = (int)local_c1;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef0
                   ,(value_type *)in_stack_fffffffffffffee8);
      }
    }
    else {
      in_RCX = local_10[0];
      if ((*(byte *)(in_RDI + 0x757) & 1) == 0) {
        __fd = (int)pipe__00;
        if ((local_71 & 1) == 0) {
          local_78 = generic_mtrie_t<zmq::pipe_t>::rm
                               (in_stack_00000040,in_stack_00000038,in_stack_00000030,
                                in_stack_00000028);
          local_d2 = 1;
          local_d3 = local_d2;
          if (local_78 == values_remain) {
            local_d3 = *(byte *)(in_RDI + 0x751);
          }
        }
        else {
          local_79 = generic_mtrie_t<zmq::pipe_t>::add
                               ((generic_mtrie_t<zmq::pipe_t> *)in_stack_ffffffffffffffb0,
                                (prefix_t)prefix_,(size_t)this_00,pipe__00);
          local_d3 = 1;
          if (!(bool)local_79) {
            local_d3 = *(byte *)(in_RDI + 0x750);
          }
        }
        local_73 = local_d3 & 1;
      }
      else {
        if ((local_71 & 1) == 0) {
          generic_mtrie_t<zmq::pipe_t>::rm
                    (in_stack_00000040,in_stack_00000038,in_stack_00000030,in_stack_00000028);
        }
        else {
          generic_mtrie_t<zmq::pipe_t>::add
                    ((generic_mtrie_t<zmq::pipe_t> *)in_stack_ffffffffffffffb0,(prefix_t)prefix_,
                     (size_t)this_00,pipe__00);
        }
        __fd = (int)local_10;
        std::deque<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_>::push_back
                  ((deque<zmq::pipe_t_*,_std::allocator<zmq::pipe_t_*>_> *)in_stack_fffffffffffffef0
                   ,(value_type *)in_stack_fffffffffffffee8);
      }
      if (((*(byte *)(in_RDI + 0x757) & 1) != 0) ||
         ((*(char *)(in_RDI + 0x14c) == '\t' && ((local_73 & 1) != 0)))) {
        blob_t::blob_t(in_stack_fffffffffffffef0,(size_t)in_stack_fffffffffffffee8);
        if ((local_71 & 1) == 0) {
          puVar4 = blob_t::data(&local_98);
          *puVar4 = '\0';
        }
        else {
          puVar4 = blob_t::data(&local_98);
          *puVar4 = '\x01';
        }
        puVar4 = blob_t::data(&local_98);
        memcpy(puVar4 + 1,pipe__00,local_70);
        std::deque<zmq::blob_t,_std::allocator<zmq::blob_t>_>::push_back
                  ((deque<zmq::blob_t,_std::allocator<zmq::blob_t>_> *)in_stack_fffffffffffffef0,
                   in_stack_fffffffffffffee8);
        if (prefix_ != (metadata_t *)0x0) {
          metadata_t::add_ref((metadata_t *)0x2e127e);
        }
        std::deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_>::push_back
                  ((deque<zmq::metadata_t_*,_std::allocator<zmq::metadata_t_*>_> *)
                   in_stack_fffffffffffffef0,(value_type *)in_stack_fffffffffffffee8);
        local_a5[0] = 0;
        __fd = (int)local_a5;
        std::deque<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                  ((deque<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffef0
                   ,(value_type *)in_stack_fffffffffffffee8);
        blob_t::~blob_t(in_stack_fffffffffffffef0);
      }
    }
    msg_t::close((msg_t *)&stack0xffffffffffffffb0,__fd);
    in_RDX = extraout_RDX;
  }
  return;
}

Assistant:

void zmq::xpub_t::xread_activated (pipe_t *pipe_)
{
    //  There are some subscriptions waiting. Let's process them.
    msg_t msg;
    while (pipe_->read (&msg)) {
        metadata_t *metadata = msg.metadata ();
        unsigned char *msg_data = static_cast<unsigned char *> (msg.data ()),
                      *data = NULL;
        size_t size = 0;
        bool subscribe = false;
        bool is_subscribe_or_cancel = false;
        bool notify = false;

        const bool first_part = !_more_recv;
        _more_recv = (msg.flags () & msg_t::more) != 0;

        if (first_part || _process_subscribe) {
            //  Apply the subscription to the trie
            if (msg.is_subscribe () || msg.is_cancel ()) {
                data = static_cast<unsigned char *> (msg.command_body ());
                size = msg.command_body_size ();
                subscribe = msg.is_subscribe ();
                is_subscribe_or_cancel = true;
            } else if (msg.size () > 0 && (*msg_data == 0 || *msg_data == 1)) {
                data = msg_data + 1;
                size = msg.size () - 1;
                subscribe = *msg_data == 1;
                is_subscribe_or_cancel = true;
            }
        }

        if (first_part)
            _process_subscribe =
              !_only_first_subscribe || is_subscribe_or_cancel;

        if (is_subscribe_or_cancel) {
            if (_manual) {
                // Store manual subscription to use on termination
                if (!subscribe)
                    _manual_subscriptions.rm (data, size, pipe_);
                else
                    _manual_subscriptions.add (data, size, pipe_);

                _pending_pipes.push_back (pipe_);
            } else {
                if (!subscribe) {
                    const mtrie_t::rm_result rm_result =
                      _subscriptions.rm (data, size, pipe_);
                    //  TODO reconsider what to do if rm_result == mtrie_t::not_found
                    notify =
                      rm_result != mtrie_t::values_remain || _verbose_unsubs;
                } else {
                    const bool first_added =
                      _subscriptions.add (data, size, pipe_);
                    notify = first_added || _verbose_subs;
                }
            }

            //  If the request was a new subscription, or the subscription
            //  was removed, or verbose mode or manual mode are enabled, store it
            //  so that it can be passed to the user on next recv call.
            if (_manual || (options.type == ZMQ_XPUB && notify)) {
                //  ZMTP 3.1 hack: we need to support sub/cancel commands, but
                //  we can't give them back to userspace as it would be an API
                //  breakage since the payload of the message is completely
                //  different. Manually craft an old-style message instead.
                //  Although with other transports it would be possible to simply
                //  reuse the same buffer and prefix a 0/1 byte to the topic, with
                //  inproc the subscribe/cancel command string is not present in
                //  the message, so this optimization is not possible.
                //  The pushback makes a copy of the data array anyway, so the
                //  number of buffer copies does not change.
                blob_t notification (size + 1);
                if (subscribe)
                    *notification.data () = 1;
                else
                    *notification.data () = 0;
                memcpy (notification.data () + 1, data, size);

                _pending_data.push_back (ZMQ_MOVE (notification));
                if (metadata)
                    metadata->add_ref ();
                _pending_metadata.push_back (metadata);
                _pending_flags.push_back (0);
            }
        } else if (options.type != ZMQ_PUB) {
            //  Process user message coming upstream from xsub socket,
            //  but not if the type is PUB, which never processes user
            //  messages
            _pending_data.push_back (blob_t (msg_data, msg.size ()));
            if (metadata)
                metadata->add_ref ();
            _pending_metadata.push_back (metadata);
            _pending_flags.push_back (msg.flags ());
        }

        msg.close ();
    }
}